

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O0

void vkt::synchronization::anon_unknown_0::createVulkanImage
               (DeviceInterface *vkd,VkDevice device,Allocator *allocator,
               ImageParameters *imageParameters,Image *image,MemoryRequirement visibility)

{
  deUint32 *pCreateInfo;
  uint uVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)9>_> data_00;
  RefData<vk::Handle<(vk::HandleType)13>_> data_01;
  VkResult result;
  Handle<(vk::HandleType)9> *pHVar2;
  Allocation *pAVar3;
  VkDeviceSize VVar4;
  Move<vk::Handle<(vk::HandleType)13>_> local_238;
  RefData<vk::Handle<(vk::HandleType)13>_> local_218;
  deUint64 local_1f8;
  deUint64 local_1f0;
  deUint32 local_1e4;
  deUint64 local_1e0;
  VkMemoryRequirements local_1d8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_1c0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_1b0;
  Move<vk::Handle<(vk::HandleType)9>_> local_190;
  RefData<vk::Handle<(vk::HandleType)9>_> local_170;
  undefined1 local_150 [8];
  VkImageMemoryBarrier imageBarrier;
  VkImageCreateInfo imageCreateParams;
  VkImageViewCreateInfo imageViewCreateInfo;
  VkImageSubresourceRange subresourceRange;
  VkComponentMapping componentMap;
  Image *image_local;
  ImageParameters *imageParameters_local;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  MemoryRequirement visibility_local;
  
  ::vk::VkImageViewCreateInfo::VkImageViewCreateInfo
            ((VkImageViewCreateInfo *)&imageCreateParams.initialLayout);
  ::vk::VkImageMemoryBarrier::VkImageMemoryBarrier((VkImageMemoryBarrier *)local_150);
  pCreateInfo = &imageBarrier.subresourceRange.layerCount;
  ::deMemset(pCreateInfo,0xcd,0x58);
  imageBarrier.subresourceRange.layerCount = 0xe;
  imageCreateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageCreateParams._4_4_ = 0;
  imageCreateParams.pNext._0_4_ = 0;
  imageCreateParams.pNext._4_4_ = imageParameters->imageType;
  imageCreateParams.flags = imageParameters->format;
  imageCreateParams.extent.width = (imageParameters->extent3D).depth;
  imageCreateParams.imageType = (imageParameters->extent3D).width;
  imageCreateParams.format = (imageParameters->extent3D).height;
  imageCreateParams.extent.height = imageParameters->mipLevels;
  imageCreateParams.extent.depth = 1;
  imageCreateParams.mipLevels = imageParameters->samples;
  imageCreateParams.arrayLayers = imageParameters->tiling;
  imageCreateParams.samples = imageParameters->usage;
  imageCreateParams.tiling = imageParameters->sharingMode;
  imageCreateParams.usage = imageParameters->queueFamilyCount;
  imageCreateParams._64_8_ = imageParameters->queueFamilyNdxList;
  imageCreateParams.pQueueFamilyIndices._0_4_ = imageParameters->initialLayout;
  ::vk::createImage(&local_190,vkd,device,(VkImageCreateInfo *)pCreateInfo,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_170,(Move *)&local_190);
  data_00.deleter.m_deviceIface = local_170.deleter.m_deviceIface;
  data_00.object.m_internal = local_170.object.m_internal;
  data_00.deleter.m_device = local_170.deleter.m_device;
  data_00.deleter.m_allocator = local_170.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(&image->image,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_190);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)9>_> *)image);
  local_1e0 = pHVar2->m_internal;
  ::vk::getImageMemoryRequirements(&local_1d8,vkd,device,(VkImage)local_1e0);
  local_1e4 = visibility.m_flags;
  (*allocator->_vptr_Allocator[3])(&local_1c0,allocator,&local_1d8,(ulong)visibility.m_flags);
  local_1b0 = de::details::MovePtr::operator_cast_to_PtrData(&local_1c0,(MovePtr *)allocator);
  data._8_8_ = local_170.deleter.m_deviceIface;
  data.ptr = (Allocation *)local_170.object.m_internal;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&image->allocation,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1c0);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)9>_> *)image);
  local_1f0 = pHVar2->m_internal;
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(image->allocation).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  local_1f8 = (deUint64)::vk::Allocation::getMemory(pAVar3);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(image->allocation).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar4 = ::vk::Allocation::getOffset(pAVar3);
  result = (*vkd->_vptr_DeviceInterface[0xd])(vkd,device,local_1f0,local_1f8,VVar4);
  ::vk::checkResult(result,
                    "vkd.bindImageMemory(device, *image.image, image.allocation->getMemory(), image.allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                    ,0x104);
  uVar1 = imageParameters->mipLevels;
  ::deMemset(&imageCreateParams.initialLayout,0xcd,0x50);
  imageCreateParams.initialLayout =
       VK_IMAGE_LAYOUT_PREINITIALIZED|VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::get
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)image);
  ::vk::createImageView
            (&local_238,vkd,device,(VkImageViewCreateInfo *)&imageCreateParams.initialLayout,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_218,(Move *)&local_238);
  data_01.deleter.m_deviceIface = local_218.deleter.m_deviceIface;
  data_01.object.m_internal = local_218.object.m_internal;
  data_01.deleter.m_device = local_218.deleter.m_device;
  data_01.deleter.m_allocator = local_218.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=(&image->imageView,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_238);
  ::deMemset(local_150,0xcd,0x48);
  local_150._0_4_ = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageBarrier._4_4_ = 0;
  imageBarrier.pNext._0_4_ = 0;
  imageBarrier.pNext._4_4_ = imageParameters->barrierInputMask;
  imageBarrier.srcAccessMask = imageParameters->initialLayout;
  imageBarrier.dstAccessMask = imageParameters->finalLayout;
  imageBarrier.oldLayout = *imageParameters->queueFamilyNdxList;
  imageBarrier.newLayout =
       imageParameters->queueFamilyNdxList[imageParameters->queueFamilyCount - 1];
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)9>_> *)image);
  imageBarrier._32_8_ = pHVar2->m_internal;
  imageBarrier.image.m_internal = 1;
  imageBarrier.subresourceRange._0_8_ = ZEXT48(uVar1);
  imageBarrier.subresourceRange.levelCount = 1;
  std::vector<vk::VkImageMemoryBarrier,_std::allocator<vk::VkImageMemoryBarrier>_>::push_back
            (&image->imageMemoryBarrier,(value_type *)local_150);
  return;
}

Assistant:

void createVulkanImage (const DeviceInterface& vkd, VkDevice device, Allocator& allocator, const ImageParameters& imageParameters, Image& image, MemoryRequirement visibility)
{
	VkComponentMapping			componentMap;
	VkImageSubresourceRange		subresourceRange;
	VkImageViewCreateInfo		imageViewCreateInfo;
	VkImageCreateInfo			imageCreateParams;
	VkImageMemoryBarrier		imageBarrier;

	deMemset(&imageCreateParams, 0xcd, sizeof(imageCreateParams));
	imageCreateParams.sType					= VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
	imageCreateParams.pNext					= DE_NULL;
	imageCreateParams.flags					= 0;
	imageCreateParams.imageType				= imageParameters.imageType;
	imageCreateParams.format				= imageParameters.format;
	imageCreateParams.extent				= imageParameters.extent3D;
	imageCreateParams.mipLevels				= imageParameters.mipLevels;
	imageCreateParams.arrayLayers			= 1;
	imageCreateParams.samples				= imageParameters.samples;
	imageCreateParams.tiling				= imageParameters.tiling;
	imageCreateParams.usage					= imageParameters.usage;
	imageCreateParams.sharingMode			= imageParameters.sharingMode;
	imageCreateParams.queueFamilyIndexCount	= imageParameters.queueFamilyCount;
	imageCreateParams.pQueueFamilyIndices	= imageParameters.queueFamilyNdxList;
	imageCreateParams.initialLayout			= imageParameters.initialLayout;

	image.image			= createImage(vkd, device, &imageCreateParams);
	image.allocation	= allocator.allocate(getImageMemoryRequirements(vkd, device, *image.image), visibility);

	VK_CHECK(vkd.bindImageMemory(device, *image.image, image.allocation->getMemory(), image.allocation->getOffset()));

	componentMap.r							= VK_COMPONENT_SWIZZLE_R;
	componentMap.g							= VK_COMPONENT_SWIZZLE_G;
	componentMap.b							= VK_COMPONENT_SWIZZLE_B;
	componentMap.a							= VK_COMPONENT_SWIZZLE_A;

	subresourceRange.aspectMask				= VK_IMAGE_ASPECT_COLOR_BIT;
	subresourceRange.baseMipLevel			= 0;
	subresourceRange.levelCount				= imageParameters.mipLevels;
	subresourceRange.baseArrayLayer			= 0;
	subresourceRange.layerCount				= 1;

	deMemset(&imageViewCreateInfo, 0xcd, sizeof(imageViewCreateInfo));
	imageViewCreateInfo.sType				= VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
	imageViewCreateInfo.pNext				= DE_NULL;
	imageViewCreateInfo.flags				= 0;
	imageViewCreateInfo.image				= image.image.get();
	imageViewCreateInfo.viewType			= VK_IMAGE_VIEW_TYPE_2D;
	imageViewCreateInfo.format				= imageParameters.format;
	imageViewCreateInfo.components			= componentMap;
	imageViewCreateInfo.subresourceRange	= subresourceRange;

	image.imageView	= createImageView(vkd, device, &imageViewCreateInfo);

	deMemset(&imageBarrier, 0xcd, sizeof(imageBarrier));
	imageBarrier.sType					= VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
	imageBarrier.pNext					= DE_NULL;
	imageBarrier.srcAccessMask			= 0;
	imageBarrier.dstAccessMask			= imageParameters.barrierInputMask;
	imageBarrier.oldLayout				= imageParameters.initialLayout;
	imageBarrier.newLayout				= imageParameters.finalLayout;
	imageBarrier.srcQueueFamilyIndex	= imageParameters.queueFamilyNdxList[0];
	imageBarrier.dstQueueFamilyIndex	= imageParameters.queueFamilyNdxList[imageParameters.queueFamilyCount-1];
	imageBarrier.image					= image.image.get();
	imageBarrier.subresourceRange		= subresourceRange;

	image.imageMemoryBarrier.push_back(imageBarrier);
}